

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_notch2_reinit(ma_notch2_config *pConfig,ma_notch2 *pFilter)

{
  double dVar1;
  ma_result mVar2;
  double __x;
  double dVar3;
  ma_biquad_config bqConfig;
  ma_biquad_config local_48;
  
  mVar2 = MA_INVALID_ARGS;
  if (pConfig != (ma_notch2_config *)0x0 && pFilter != (ma_notch2 *)0x0) {
    dVar1 = pConfig->q;
    __x = (pConfig->frequency * 6.283185307179586) / (double)pConfig->sampleRate;
    dVar3 = sin(__x);
    local_48.b1 = sin(1.5707963267948966 - __x);
    dVar3 = dVar3 / (dVar1 + dVar1);
    local_48.b1 = local_48.b1 * -2.0;
    local_48.a0 = dVar3 + 1.0;
    local_48.a2 = 1.0 - dVar3;
    local_48.format = pConfig->format;
    local_48.channels = pConfig->channels;
    local_48.b0 = 1.0;
    local_48.b2 = 1.0;
    local_48.a1 = local_48.b1;
    mVar2 = ma_biquad_reinit(&local_48,&pFilter->bq);
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_notch2_reinit(const ma_notch2_config* pConfig, ma_notch2* pFilter)
{
    ma_result result;
    ma_biquad_config bqConfig;

    if (pFilter == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    bqConfig = ma_notch2__get_biquad_config(pConfig);
    result = ma_biquad_reinit(&bqConfig, &pFilter->bq);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}